

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  float fVar1;
  pointer argv_00;
  bool bVar2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar6;
  typed_value<float,_char> *ptVar7;
  size_type sVar8;
  void *this;
  variable_value *pvVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  float *pfVar11;
  int *piVar12;
  ostream *poVar13;
  bool local_811;
  vector<int,_std::allocator<int>_> local_728;
  Mat local_708 [96];
  _InputArray local_6a8;
  string local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  MatSize local_610 [4];
  int local_60c;
  int local_608 [2];
  undefined1 local_600 [8];
  Rect cropRectangle;
  Rect *faceArea;
  iterator __end1;
  iterator __begin1;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *__range1;
  int imageId;
  Size_<int> local_5c0;
  _InputArray local_5b8;
  undefined1 local_5a0 [8];
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> detectedFaces;
  Size minimumFaceSize;
  int minimumFaceLength;
  MatSize local_574 [4];
  int local_570;
  int local_56c;
  undefined1 local_568 [4];
  int greatestImageSideLength;
  string local_528 [39];
  allocator<char> local_501;
  string local_500 [32];
  FileStorage local_4e0 [8];
  FileStorage fs;
  CascadeClassifier local_4a0 [8];
  CascadeClassifier cascade;
  undefined1 local_490 [8];
  Mat inputImage;
  path local_430;
  path local_408;
  path local_3e0;
  allocator<char> local_3b1;
  string local_3b0;
  float local_390;
  allocator<char> local_389;
  float minimumSize;
  float local_368;
  allocator<char> local_361;
  float zoomLevel;
  undefined1 local_340 [8];
  string outputPath;
  string local_318;
  undefined1 local_2f8 [8];
  string modelPath;
  string local_2d0;
  undefined1 local_2b0 [8];
  string inputPath;
  key_type local_288;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_268;
  basic_parsed_options<char> local_240;
  allocator<char> local_211;
  string local_210;
  float local_1ec;
  float local_1e8;
  allocator<char> local_1e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  allocator<char> local_1b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined8 local_198;
  allocator<char> local_189;
  string local_188 [32];
  options_description local_168 [8];
  options_description desc;
  variables_map local_e8 [8];
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_d8 [167];
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_31;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argList;
  char **argv_local;
  int argc_local;
  
  argList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_31);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_30,argv,
             argv + argc,&local_31);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_31);
  boost::program_options::variables_map::variables_map(local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_188,"Options for helium",&local_189);
  boost::program_options::options_description::options_description
            (local_168,local_188,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  local_198 = boost::program_options::options_description::add_options();
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_198,"help");
  ptVar6 = boost::program_options::value<std::__cxx11::string>();
  ptVar6 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::required(ptVar6);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"input",(char *)ptVar6);
  ptVar6 = boost::program_options::value<std::__cxx11::string>();
  ptVar6 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::required(ptVar6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"out",&local_1b9);
  ptVar6 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar6,&local_1b8);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"output",(char *)ptVar6);
  ptVar6 = boost::program_options::value<std::__cxx11::string>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"internal",&local_1e1);
  ptVar6 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar6,&local_1e0);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"model",(char *)ptVar6);
  ptVar7 = boost::program_options::value<float>();
  local_1e8 = 2.0;
  ptVar7 = boost::program_options::typed_value<float,_char>::default_value(ptVar7,&local_1e8);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"zoom",(char *)ptVar7);
  ptVar7 = boost::program_options::value<float>();
  local_1ec = 0.05;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"0.05",&local_211);
  ptVar7 = boost::program_options::typed_value<float,_char>::default_value
                     (ptVar7,&local_1ec,&local_210);
  boost::program_options::options_description_easy_init::operator()
            (pcVar5,(value_semantic *)"min-size",(char *)ptVar7);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  argv_00 = argList.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_268.super_function_base.functor._8_8_ = 0;
  local_268.super_function_base.functor._16_8_ = 0;
  local_268.super_function_base.vtable = (vtable_base *)0x0;
  local_268.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1(&local_268);
  boost::program_options::parse_command_line<char>
            (&local_240,argc,(char **)argv_00,local_168,0,&local_268);
  boost::program_options::store((basic_parsed_options *)&local_240,local_e8,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_240);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"help",(allocator<char> *)(inputPath.field_2._M_local_buf + 0xf));
  sVar8 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_d8,&local_288);
  local_811 = sVar8 != 0 || argc == 1;
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator((allocator<char> *)(inputPath.field_2._M_local_buf + 0xf));
  if (local_811) {
    this = (void *)boost::program_options::operator<<((ostream *)&std::cout,local_168);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
    inputPath.field_2._8_4_ = 1;
    goto LAB_00109ff7;
  }
  boost::program_options::notify(local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"input",(allocator<char> *)(modelPath.field_2._M_local_buf + 0xf))
  ;
  pvVar9 = boost::program_options::variables_map::operator[](local_e8,&local_2d0);
  pbVar10 = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar9);
  std::__cxx11::string::string((string *)local_2b0,(string *)pbVar10);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)(modelPath.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_318,"model",(allocator<char> *)(outputPath.field_2._M_local_buf + 0xf)
            );
  pvVar9 = boost::program_options::variables_map::operator[](local_e8,&local_318);
  pbVar10 = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar9);
  std::__cxx11::string::string((string *)local_2f8,(string *)pbVar10);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator((allocator<char> *)(outputPath.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&zoomLevel,"output",&local_361);
  pvVar9 = boost::program_options::variables_map::operator[](local_e8,(string *)&zoomLevel);
  pbVar10 = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar9);
  std::__cxx11::string::string((string *)local_340,(string *)pbVar10);
  std::__cxx11::string::~string((string *)&zoomLevel);
  std::allocator<char>::~allocator(&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&minimumSize,"zoom",&local_389);
  pvVar9 = boost::program_options::variables_map::operator[](local_e8,(string *)&minimumSize);
  pfVar11 = boost::program_options::variable_value::as<float>(pvVar9);
  fVar1 = *pfVar11;
  std::__cxx11::string::~string((string *)&minimumSize);
  std::allocator<char>::~allocator(&local_389);
  local_368 = fVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"min-size",&local_3b1);
  pvVar9 = boost::program_options::variables_map::operator[](local_e8,&local_3b0);
  pfVar11 = boost::program_options::variable_value::as<float>(pvVar9);
  fVar1 = *pfVar11;
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  local_390 = fVar1;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_3e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
             auto_format);
  bVar2 = std::filesystem::is_regular_file(&local_3e0);
  std::filesystem::__cxx11::path::~path(&local_3e0);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_408,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340,
               auto_format);
    bVar2 = std::filesystem::is_directory(&local_408);
    std::filesystem::__cxx11::path::~path(&local_408);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_430,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340,
                 auto_format);
      bVar3 = std::filesystem::create_directory(&local_430);
      std::filesystem::__cxx11::path::~path(&local_430);
      if (((bVar3 ^ 0xff) & 1) != 0) {
        poVar13 = std::operator<<((ostream *)&std::cerr,(string *)local_340);
        poVar13 = std::operator<<(poVar13," is not a directory and could not be created.");
        std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = -1;
        inputPath.field_2._8_4_ = 1;
        goto LAB_00109fab;
      }
    }
    cv::imread((string *)local_490,(int)local_2b0);
    bVar3 = cv::Mat::empty();
    if ((bVar3 & 1) == 0) {
      cv::CascadeClassifier::CascadeClassifier(local_4a0);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2f8,"internal");
      if (bVar2) {
        cv::FileStorage::FileStorage(local_4e0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_500,
                   "<?xml version=\"1.0\"?>\n<!--\n    Tree-based 20x20 gentle adaboost frontal face detector.\n    Created by Rainer Lienhart.\n\n////////////////////////////////////////////////////////////////////////////////////////\n\n  IMPORTANT: READ BEFORE DOWNLOADING, COPYING, INSTALLING OR USING.\n\n  By downloading, copying, installing or using the software you agree to this license.\n  If you do not agree to this license, do not download, install,\n  copy or use the software.\n\n\n                        Intel License Agreement\n                For Open Source Computer Vision Library\n\n Copyright (C) 2000, Intel Corporation, all rights reserved.\n Third party copyrights are property of their respective owners.\n\n Redistribution and use in source and binary forms, with or without modification,\n are permitted provided that the following conditions are met:\n\n   * Redistribution\'s of source code must retain the above copyright notice,\n     this list of conditions and the following disclaimer.\n\n   * Redistribution\'s in binary form must reproduce the above copyright notice,\n     this list of conditions and the following disclaimer in the documentation\n     and/or other materials provided with the distribution.\n\n   * The name of Intel Corporation may not be used to endorse or promote products\n     derived from this software without specific prior written permission.\n\n This software is provided by the copyright holders and contributors \"as is\" and\n any express or implied warranties, including, but not limited to, the implied\n warranties of merchantability and fitness for a particular purpose are disclaimed.\n In no event shall the Intel Corporation or contributors be liable for any direct,\n indirect, incidental, special, exemplary, or consequential damages\n (including, but not limited to, procurement of substitute goods or services;\n loss of use, data, or profits; or business interruption) however caused\n and on any theory of liability, whether in contract, strict liability,\n or tort (including negligence or otherwise) arising in any way out of\n the ..." /* TRUNCATED STRING LITERAL */
                   ,&local_501);
        std::__cxx11::string::string(local_528);
        cv::FileStorage::open((string *)local_4e0,(int)local_500,(string *)0x4);
        std::__cxx11::string::~string(local_528);
        std::__cxx11::string::~string(local_500);
        std::allocator<char>::~allocator(&local_501);
        cv::FileStorage::getFirstTopLevelNode();
        cv::CascadeClassifier::read((FileNode *)local_4a0);
        cv::FileStorage::~FileStorage(local_4e0);
LAB_001099cf:
        cv::MatSize::operator()(local_574);
        cv::MatSize::operator()((MatSize *)&minimumFaceSize.height);
        piVar12 = std::max<int>(&local_570,&minimumFaceSize.height);
        local_56c = *piVar12;
        minimumFaceSize.width = (int)((float)local_56c * local_390);
        cv::Size_<int>::Size_
                  ((Size_<int> *)
                   &detectedFaces.
                    super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,minimumFaceSize.width,
                   minimumFaceSize.width);
        std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
                  ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_5a0);
        cv::_InputArray::_InputArray(&local_5b8,(Mat *)local_490);
        cv::Size_<int>::Size_
                  (&local_5c0,
                   (Size_<int> *)
                   &detectedFaces.
                    super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        cv::Size_<int>::Size_((Size_<int> *)&stack0xfffffffffffffa38);
        cv::CascadeClassifier::detectMultiScale
                  (0x9999999a,local_4a0,&local_5b8,local_5a0,3,0,&local_5c0,&stack0xfffffffffffffa38
                  );
        cv::_InputArray::~_InputArray(&local_5b8);
        __range1._4_4_ = 1;
        __end1 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::begin
                           ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_5a0);
        faceArea = (Rect *)std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::end
                                     ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                                      local_5a0);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end1,(__normal_iterator<cv::Rect_<int>_*,_std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_>
                                           *)&faceArea), bVar2) {
          cropRectangle._8_8_ =
               __gnu_cxx::
               __normal_iterator<cv::Rect_<int>_*,_std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_>
               ::operator*(&__end1);
          cv::Rect_<int>::Rect_((Rect_<int> *)local_600,(Rect_<int> *)cropRectangle._8_8_);
          cropRectangle.x = (int)((float)*(int *)(cropRectangle._8_8_ + 8) * local_368);
          cropRectangle.y = (int)((float)*(int *)(cropRectangle._8_8_ + 0xc) * local_368);
          local_600._0_4_ =
               (*(int *)(cropRectangle._8_8_ + 8) - cropRectangle.x) / 2 + local_600._0_4_;
          local_600._4_4_ =
               (*(int *)(cropRectangle._8_8_ + 0xc) - cropRectangle.y) / 2 + local_600._4_4_;
          bVar2 = true;
          if ((-1 < (int)local_600._0_4_) && (bVar2 = true, -1 < (int)local_600._4_4_)) {
            iVar4 = local_600._0_4_ + cropRectangle.x;
            cv::MatSize::operator()((MatSize *)local_608);
            bVar2 = true;
            if (iVar4 <= local_608[0]) {
              iVar4 = local_600._4_4_ + cropRectangle.y;
              cv::MatSize::operator()(local_610);
              bVar2 = local_60c < iVar4;
            }
          }
          if (bVar2) {
            poVar13 = std::operator<<((ostream *)&std::cerr,"Face ");
            poVar13 = cv::operator<<(poVar13,(Rect_<int> *)cropRectangle._8_8_);
            poVar13 = std::operator<<(poVar13," could not be saved (zoom too large)");
            std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
          }
          else {
            std::operator+(&local_670,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_340,"/");
            std::__cxx11::to_string(&local_690,__range1._4_4_);
            std::operator+(&local_650,&local_670,&local_690);
            std::operator+(&local_630,&local_650,".jpg");
            cv::Mat::operator()(local_708,(Rect *)local_490);
            cv::_InputArray::_InputArray(&local_6a8,local_708);
            local_728.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            local_728.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            local_728.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            std::vector<int,_std::allocator<int>_>::vector(&local_728);
            cv::imwrite((string *)&local_630,&local_6a8,(vector *)&local_728);
            std::vector<int,_std::allocator<int>_>::~vector(&local_728);
            cv::_InputArray::~_InputArray(&local_6a8);
            cv::Mat::~Mat(local_708);
            std::__cxx11::string::~string((string *)&local_630);
            std::__cxx11::string::~string((string *)&local_650);
            std::__cxx11::string::~string((string *)&local_690);
            std::__cxx11::string::~string((string *)&local_670);
            __range1._4_4_ = __range1._4_4_ + 1;
          }
          __gnu_cxx::
          __normal_iterator<cv::Rect_<int>_*,_std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_>
          ::operator++(&__end1);
        }
        argv_local._4_4_ = 0;
        inputPath.field_2._8_4_ = 1;
        std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~vector
                  ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_5a0);
      }
      else {
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  ((path *)local_568,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
                   auto_format);
        bVar2 = std::filesystem::is_regular_file((path *)local_568);
        std::filesystem::__cxx11::path::~path((path *)local_568);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          cv::CascadeClassifier::load((string *)local_4a0);
          goto LAB_001099cf;
        }
        poVar13 = std::operator<<((ostream *)&std::cerr,(string *)local_2f8);
        poVar13 = std::operator<<(poVar13," does not exist.");
        std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = -1;
        inputPath.field_2._8_4_ = 1;
      }
      cv::CascadeClassifier::~CascadeClassifier(local_4a0);
    }
    else {
      poVar13 = std::operator<<((ostream *)&std::cerr,(string *)local_2b0);
      poVar13 = std::operator<<(poVar13," couldn\'t be read");
      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = -1;
      inputPath.field_2._8_4_ = 1;
    }
    cv::Mat::~Mat((Mat *)local_490);
  }
  else {
    poVar13 = std::operator<<((ostream *)&std::cerr,(string *)local_2b0);
    poVar13 = std::operator<<(poVar13," is not a file.");
    std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = -1;
    inputPath.field_2._8_4_ = 1;
  }
LAB_00109fab:
  std::__cxx11::string::~string((string *)local_340);
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::~string((string *)local_2b0);
LAB_00109ff7:
  boost::program_options::options_description::~options_description(local_168);
  boost::program_options::variables_map::~variables_map(local_e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
  std::vector<std::string> argList(argv, argv + argc);
  po::variables_map vm;

  // Get options
  po::options_description desc("Options for helium");
  desc.add_options()("help", "produce help message")(
      "input", po::value<std::string>()->required(), "input file")(
      "output", po::value<std::string>()->required()->default_value("out"),
      "output folder")(
      "model", po::value<std::string>()->default_value("internal"),
      "model file ('internal' to use haarcascade_frontalface_alt2)")(
      "zoom", po::value<float>()->default_value(2),
      "zoom factor (0.5 = half size, 2 = double size)")(
      "min-size", po::value<float>()->default_value(0.05, "0.05"),
      "minimum face size (0.05 = 5% of image size, 0.5 = 50% of image "
      "size)");
  po::store(po::parse_command_line(argc, argv, desc), vm);

  // Return help message
  if (vm.count("help") || argc == 1) {
    std::cout << desc << std::endl;
    return 1;
  }

  // Raise errors about incorrect options
  po::notify(vm);

  // Cast variables from  variable map
  const std::string inputPath = vm["input"].as<std::string>();
  const std::string modelPath = vm["model"].as<std::string>();
  const std::string outputPath = vm["output"].as<std::string>();
  const float zoomLevel = vm["zoom"].as<float>();
  const float minimumSize = vm["min-size"].as<float>();

  // Error if input path is not a file
  if (!fs::is_regular_file(inputPath)) {
    std::cerr << inputPath << " is not a file." << std::endl;
    return -1;
  }

  // Ensure the output path exists or can be created
  if (!fs::is_directory(outputPath)) {
    if (!fs::create_directory(outputPath)) {
      std::cerr << outputPath << " is not a directory and could not be created."
                << std::endl;
      return -1;
    }
  }

  // Load the input image
  cv::Mat inputImage = cv::imread(inputPath);

  // Error if image is empty
  if (inputImage.empty()) {
    std::cerr << inputPath << " couldn't be read" << std::endl;
    return -1;
  }

  // Initialize cascade classifier
  CascadeClassifier cascade;

  if (modelPath == "internal") {
    // Open in-memory model
    cv::FileStorage fs;
    fs.open(std::string(cascade_model),
            FileStorage::READ | FileStorage::MEMORY);

    // Load model into cascade classifier
    cascade.read(fs.getFirstTopLevelNode());
  } else {
    // Error if model path is not a file
    if (!fs::is_regular_file(modelPath)) {
      std::cerr << modelPath << " does not exist." << std::endl;
      return -1;
    }

    // Load model into cascade classifier
    cascade.load(modelPath);
  }

  // The minimum size for detected faces is based on the larger of the
  // image's sides multiplied by a ratio
  const int greatestImageSideLength =
      max(inputImage.size().height, inputImage.size().width);
  const int minimumFaceLength = (greatestImageSideLength * minimumSize);
  cv::Size minimumFaceSize = cv::Size(minimumFaceLength, minimumFaceLength);

  // Use the cascade model to detect faces as Rects in detectedFaces
  std::vector<Rect> detectedFaces;
  cascade.detectMultiScale(inputImage, detectedFaces, 1.1, 3, 0,
                           minimumFaceSize);

  // Loop over every detected face
  int imageId = 1;
  for (const Rect &faceArea : detectedFaces) {
    // Set the crop rectangle to the detected face before performing zoom
    // transformation
    Rect cropRectangle = faceArea;

    // Apply the zoom level
    cropRectangle.width = faceArea.width * zoomLevel;
    cropRectangle.height = faceArea.height * zoomLevel;

    cropRectangle.x += ((faceArea.width - cropRectangle.width) / 2);
    cropRectangle.y += ((faceArea.height - cropRectangle.height) / 2);

    // If the new crop rectangle would try to read nonexistent pixels, skip
    if ((cropRectangle.x < 0) || (cropRectangle.y < 0) ||
        ((cropRectangle.x + cropRectangle.width) > inputImage.size().width) ||
        ((cropRectangle.y + cropRectangle.height) > inputImage.size().height)) {
      std::cerr << "Face " << faceArea << " could not be saved (zoom too large)"
                << std::endl;
      continue;
    }

    // Write a cropped version of the image
    cv::imwrite((outputPath + "/" + std::to_string(imageId) + ".jpg"),
                inputImage(cropRectangle));

    imageId++;
  }
  return 0;
}